

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relation.h
# Opt level: O1

bool __thiscall tupleCompare::operator()(tupleCompare *this,Tuple *A,Tuple *B)

{
  int in_EAX;
  int iVar1;
  ulong uVar2;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  bool bVar6;
  bool bVar7;
  
  uVar3 = (uint)((ulong)((long)(A->data).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(A->data).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 5);
  bVar6 = 0 < (int)uVar3;
  if (0 < (int)uVar3) {
    uVar2 = (ulong)((long)(B->data).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(B->data).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 5;
    in_EAX = 0;
    if (0 < (int)uVar2) {
      lVar4 = 0;
      uVar5 = 1;
      do {
        iVar1 = std::__cxx11::string::compare
                          ((string *)
                           ((long)&(((A->data).
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                           lVar4));
        if (iVar1 < 0) {
          in_EAX = 1;
          goto LAB_0010ffbf;
        }
        in_EAX = std::__cxx11::string::compare
                           ((string *)
                            ((long)&(((A->data).
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p
                            + lVar4));
        if (0 < in_EAX) break;
        bVar6 = uVar5 < (uVar3 & 0x7fffffff);
        if (uVar5 == (uVar3 & 0x7fffffff)) goto LAB_0010ffbf;
        lVar4 = lVar4 + 0x20;
        bVar7 = uVar5 != (uVar2 & 0xffffffff);
        uVar5 = uVar5 + 1;
      } while (bVar7);
      in_EAX = 0;
    }
  }
LAB_0010ffbf:
  return (bool)(bVar6 & (byte)in_EAX);
}

Assistant:

bool operator()(const Tuple& A, const Tuple& B)
 {
//   cout << "Called compare" << endl;
   int lA = A.data.size();
   int lB = B.data.size();
   for (int i = 0; i < lA; i++)
   {
    // cout << lB << "comparing " << A[i] << " to " << B[i] << endl;
     if (i >= lB) return false;
     if (A.data[i] < B.data[i]) return true;
     else if (A.data[i] > B.data[i]) return false;
   }
   return false;
 }